

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::
StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>::
noteExpressionOrCopy
          (StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
           *this,Expression *expr,HeapType type,Index index,PossibleConstantValues *info)

{
  bool bVar1;
  FallthroughBehavior behavior;
  PassOptions *passOptions;
  Module *module;
  bool local_81;
  HeapType local_50;
  BasicType local_44;
  StructGet *local_40;
  StructGet *get;
  Expression *fallthrough;
  PossibleConstantValues *info_local;
  StructGet *pSStack_20;
  Index index_local;
  Expression *expr_local;
  StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner> *this_local;
  HeapType type_local;
  
  fallthrough = (Expression *)info;
  info_local._4_4_ = index;
  pSStack_20 = (StructGet *)expr;
  expr_local = (Expression *)this;
  this_local = (StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                *)type.id;
  passOptions = Pass::getPassOptions((Pass *)this);
  module = Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                        ).
                        super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                        .
                        super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                      );
  behavior = getFallthroughBehavior(this);
  get = (StructGet *)Properties::getFallthrough(expr,passOptions,module,behavior);
  bVar1 = wasm::Type::operator==
                    (&(get->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.
                      type,&(pSStack_20->super_SpecificExpression<(wasm::Expression::Id)66>).
                            super_Expression.type);
  if (bVar1) {
    pSStack_20 = get;
  }
  local_40 = Expression::dynCast<wasm::StructGet>((Expression *)pSStack_20);
  if (local_40 != (StructGet *)0x0) {
    local_81 = false;
    if (local_40->index == info_local._4_4_) {
      local_44 = unreachable;
      bVar1 = wasm::Type::operator!=(&local_40->ref->type,&local_44);
      local_81 = false;
      if (bVar1) {
        local_50 = wasm::Type::getHeapType(&local_40->ref->type);
        local_81 = HeapType::operator==(&local_50,(HeapType *)&this_local);
      }
    }
    if (local_81 != false) {
      anon_unknown_173::PCVScanner::noteCopy
                ((PCVScanner *)this,(HeapType)this_local,info_local._4_4_,
                 (PossibleConstantValues *)fallthrough);
      return;
    }
  }
  anon_unknown_173::PCVScanner::noteExpression
            ((PCVScanner *)this,(Expression *)pSStack_20,(HeapType)this_local,info_local._4_4_,
             (PossibleConstantValues *)fallthrough);
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }